

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::togglelockspec_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  uint cn;
  int cn_00;
  uint uVar2;
  char *pcVar3;
  clientinfo *ci;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    cn = atoi(args[1]);
    if (1000 < cn) {
      cn_00 = QServ::getSender(&qs);
      pcVar3 = QServ::getCommandDesc(&qs,cid);
      goto LAB_00151176;
    }
  }
  else {
    cn = QServ::getSender(&qs);
  }
  ci = QServ::getClient(&qs,cn);
  if (ci == (clientinfo *)0x0) {
    cn_00 = QServ::getSender(&qs);
    pcVar3 = "\f3Error: Player not connected";
  }
  else {
    if ((((ci->connected != true) || (uVar2 = QServ::getSender(&qs), 1000 < cn)) || (cn == uVar2))
       || ((ci->connected != true || (args[1] == (char *)0x0)))) {
      return;
    }
    if (ci->isSpecLocked == false) {
      forcespectator(ci);
      ci->isSpecLocked = true;
      cn_00 = ci->clientnum;
      pcVar3 = "\f3You have been locked in spectator mode.";
    }
    else {
      unspectate(ci);
      ci->isSpecLocked = false;
      cn_00 = ci->clientnum;
      pcVar3 = "\f3You are no longer locked in spectator mode.";
    }
  }
LAB_00151176:
  sendf(cn_00,1,"ris",0x23,pcVar3);
  return;
}

Assistant:

QSERV_CALLBACK togglelockspec_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    lockspecprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                        
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                if(!ci->isSpecLocked) {
                                    forcespectator(ci);
                                    ci->isSpecLocked = true;
                                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3You have been locked in spectator mode.");
                            } else if(ci->isSpecLocked) {
                                    unspectate(ci);
                                    ci->isSpecLocked = false;
                                    sendf(ci->clientnum, 1, "ris", N_SERVMSG, "\f3You are no longer locked in spectator mode.");
                        }
            
                    }
                           
                        }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto lockspecprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }